

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

void __thiscall FSerializer::EndArray(FSerializer *this)

{
  FWriter *this_00;
  TArray<FJSONObject,_FJSONObject> *pTVar1;
  uint uVar2;
  
  this_00 = this->w;
  if (this_00 == (FWriter *)0x0) {
    uVar2 = (this->r->mObjects).Count;
    if (uVar2 == 0) {
      return;
    }
    pTVar1 = &this->r->mObjects;
  }
  else {
    uVar2 = (this_00->mInObject).Count;
    if ((uVar2 != 0) && ((this_00->mInObject).Array[uVar2 - 1] != false)) {
      __assert_fail("false && \"EndArray call not inside an array\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x2b0,"void FSerializer::EndArray()");
    }
    FWriter::EndArray(this_00);
    uVar2 = (this->w->mInObject).Count;
    if (uVar2 == 0) {
      return;
    }
    pTVar1 = (TArray<FJSONObject,_FJSONObject> *)&this->w->mInObject;
  }
  pTVar1->Count = uVar2 - 1;
  return;
}

Assistant:

void FSerializer::EndArray()
{
	if (isWriting())
	{
		if (!w->inObject())
		{
			w->EndArray();
			w->mInObject.Pop();
		}
		else
		{
			assert(false && "EndArray call not inside an array");
			I_Error("EndArray call not inside an array");
		}
	}
	else
	{
		r->mObjects.Pop();
	}
}